

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O2

iterator * __thiscall QTextBlock::end(iterator *__return_storage_ptr__,QTextBlock *this)

{
  int k;
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  if ((this->p == (QTextDocumentPrivate *)0x0) || (this->n == 0)) {
    __return_storage_ptr__->p = (QTextDocumentPrivate *)0x0;
    __return_storage_ptr__->b = 0;
    __return_storage_ptr__->e = 0;
    *(undefined8 *)&__return_storage_ptr__->n = 0;
  }
  else {
    k = position(this);
    iVar1 = length(this);
    uVar2 = QFragmentMapData<QTextFragmentData>::findNode(&(this->p->fragments).data,k,0);
    uVar3 = QFragmentMapData<QTextFragmentData>::findNode
                      (&(this->p->fragments).data,k + iVar1 + -1,0);
    __return_storage_ptr__->p = this->p;
    __return_storage_ptr__->b = uVar2;
    __return_storage_ptr__->e = uVar3;
    __return_storage_ptr__->n = uVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

QTextBlock::iterator QTextBlock::end() const
{
    if (!p || !n)
        return iterator();

    int pos = position();
    int len = length() - 1; // exclude the fragment that holds the paragraph separator
    int b = p->fragmentMap().findNode(pos);
    int e = p->fragmentMap().findNode(pos+len);
    return iterator(p, b, e, e);
}